

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpSetMaxContentLength(size_t contentLength)

{
  if (UpnpSdkInit == 1) {
    g_maxContentLength = contentLength;
    return 0;
  }
  return -0x74;
}

Assistant:

int UpnpSetMaxContentLength(size_t contentLength)
{
	int errCode = UPNP_E_SUCCESS;

	do {
		if (UpnpSdkInit != 1) {
			errCode = UPNP_E_FINISH;
			break;
		}
		g_maxContentLength = contentLength;
	} while (0);

	return errCode;
}